

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O0

void __thiscall KosarajuSCC::_set_levels(KosarajuSCC *this,int start,int sink)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  size_type sVar11;
  long *in_RDI;
  reference rVar12;
  int v_1;
  int e_1;
  uint i_1;
  int min;
  int u_1;
  queue<int,_std::deque<int,_std::allocator<int>_>_> topo;
  int v;
  int e;
  uint i;
  int u;
  int mand_sccs;
  int edges;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  matrix;
  vector<bool,_std::allocator<bool>_> seen;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  scc_graph_ends;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  scc_graph_out;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  int start_scc;
  undefined4 in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  KosarajuSCC *in_stack_fffffffffffffad0;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  value_type vVar13;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffae0;
  mapped_type *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined8 in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  byte local_3aa;
  reference local_300;
  int local_2ec;
  int local_2e8;
  uint local_2e4;
  int local_2e0;
  value_type local_2dc;
  int local_2d4;
  undefined1 local_2b1;
  reference local_238;
  int local_228;
  int local_224;
  value_type local_220;
  int local_21c;
  uint local_218;
  int local_214;
  reference local_210;
  reference local_200;
  reference local_1f0;
  value_type local_1dc;
  int local_1d8;
  int local_1d4;
  undefined1 local_1d0 [56];
  undefined1 local_198 [60];
  undefined4 local_15c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_140;
  undefined1 local_121;
  undefined1 local_f1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_90 [5];
  int local_14;
  
  local_14 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_fffffffffffffad0);
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_fffffffffffffad0,
             (value_type *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  nb_sccs((KosarajuSCC *)0x2a25e9);
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2a262f);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2a2644);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
           (size_type)in_stack_fffffffffffffae8,(value_type *)in_stack_fffffffffffffae0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2a2678);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x2a2692);
  nb_sccs((KosarajuSCC *)0x2a269f);
  local_f1 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x2a26d6);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
             (size_type)in_stack_fffffffffffffae8,(bool *)in_stack_fffffffffffffae0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  std::vector<bool,_std::allocator<bool>_>::operator=
            (in_stack_fffffffffffffae0,
             (vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x2a272e)
  ;
  std::allocator<bool>::~allocator((allocator<bool> *)0x2a273b);
  local_121 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x2a276c);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
             (size_type)in_stack_fffffffffffffae8,(bool *)in_stack_fffffffffffffae0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  std::allocator<bool>::~allocator((allocator<bool> *)0x2a27a0);
  nb_sccs((KosarajuSCC *)0x2a27ad);
  nb_sccs((KosarajuSCC *)0x2a27d4);
  local_15c = 0;
  std::allocator<int>::allocator((allocator<int> *)0x2a280e);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
             (size_type)in_stack_fffffffffffffae8,(value_type_conflict *)in_stack_fffffffffffffae0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2a284a);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
           (size_type)in_stack_fffffffffffffae8,(value_type *)in_stack_fffffffffffffae0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2a287e);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0);
  std::allocator<int>::~allocator((allocator<int> *)0x2a2898);
  memset(local_198,0,0x38);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x2a28b9);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)in_stack_fffffffffffffad0,
              (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)0x2a28e2);
  memset(local_1d0,0,0x38);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x2a2903);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)in_stack_fffffffffffffad0,
              (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)0x2a292c);
  local_1d4 = 0;
  local_1d8 = 0;
  while( true ) {
    bVar1 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                      ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a294f);
    iVar3 = (int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar5 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                       ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a2977);
    local_1dc = *pvVar5;
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                        (size_type)in_stack_fffffffffffffae8);
    local_1f0 = rVar12;
    std::_Bit_reference::operator=(&local_1f0,true);
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a29f8);
    bVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_1dc);
    local_3aa = 0;
    if ((bVar2 & 1) != 0) {
      scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                          (size_type)in_stack_fffffffffffffae8);
      local_200 = rVar12;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_200);
      local_3aa = bVar1 ^ 0xff;
    }
    if ((local_3aa & 1) != 0) {
      scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                          (size_type)in_stack_fffffffffffffae8);
      local_210 = rVar12;
      std::_Bit_reference::operator=(&local_210,true);
      vVar13 = local_1dc;
      local_214 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
      pmVar6 = std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)in_stack_fffffffffffffad0,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      *pmVar6 = vVar13;
      local_1d8 = local_1d8 + 1;
    }
    local_218 = 0;
    while( true ) {
      uVar7 = (ulong)local_218;
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)(in_RDI + 2),(long)local_1dc);
      sVar11 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
      if (sVar11 <= uVar7) break;
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)(in_RDI + 2),(long)local_1dc);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(ulong)local_218);
      local_21c = *pvVar8;
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)(in_RDI + 8),(long)local_21c);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,1);
      local_220 = *pvVar8;
      bVar2 = (**(code **)(*in_RDI + 0x10))(in_RDI,local_21c);
      if ((bVar2 & 1) == 0) {
        bVar2 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_220);
        if ((bVar2 & 1) == 0) {
          iVar3 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
          iVar4 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
          if (iVar3 != iVar4) {
            iVar3 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
            pvVar10 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_140,(long)iVar3);
            iVar3 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)iVar3);
            if (*pvVar8 == 0) {
              iVar3 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](local_90,(long)iVar3);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0,
                         (value_type_conflict *)
                         CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::emplace_back<>((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)in_stack_fffffffffffffad0);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)in_stack_fffffffffffffad0);
              local_224 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffad0,
                         (value_type_conflict *)
                         CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)in_stack_fffffffffffffad0);
              local_228 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffad0,
                         (value_type_conflict *)
                         CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
              local_1d4 = local_1d4 + 1;
              iVar3 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
              pvVar10 = std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[](&local_140,(long)iVar3);
              iVar3 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)iVar3);
              *pvVar8 = 1;
            }
          }
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                              (size_type)in_stack_fffffffffffffae8);
          local_238 = rVar12;
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_238);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                      ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffad0,
                       (value_type *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
          }
        }
      }
      local_218 = local_218 + 1;
    }
  }
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_fffffffffffffad0);
  nb_sccs((KosarajuSCC *)0x2a312f);
  local_2b1 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x2a3166);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
             (size_type)in_stack_fffffffffffffae8,(bool *)in_stack_fffffffffffffae0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  std::vector<bool,_std::allocator<bool>_>::operator=
            (in_stack_fffffffffffffae0,
             (vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x2a31bf)
  ;
  std::allocator<bool>::~allocator((allocator<bool> *)0x2a31cc);
  topological_sort((KosarajuSCC *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                   iVar3,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                   in_stack_fffffffffffffb18,
                   (queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                   (vector<bool,_std::allocator<bool>_> *)
                   CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  nb_sccs((KosarajuSCC *)0x2a320f);
  local_2d4 = nb_sccs((KosarajuSCC *)0x2a3236);
  local_2d4 = local_2d4 + 10;
  std::allocator<int>::allocator((allocator<int> *)0x2a3265);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
             (size_type)in_stack_fffffffffffffae8,(value_type_conflict *)in_stack_fffffffffffffae0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0,
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0);
  std::allocator<int>::~allocator((allocator<int> *)0x2a32c9);
  iVar3 = local_1d8;
  iVar4 = scc_of(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)iVar4);
  *pvVar8 = iVar3;
  while( true ) {
    bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                      ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a331e);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar9 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a3340);
    local_2dc = *pvVar9;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a3362);
    local_2e0 = nb_sccs((KosarajuSCC *)0x2a3371);
    local_2e0 = local_2e0 + 10;
    local_2e4 = 0;
    while( true ) {
      uVar7 = (ulong)local_2e4;
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](local_90,(long)local_2dc);
      sVar11 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
      if (sVar11 <= uVar7) break;
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](local_90,(long)local_2dc);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(ulong)local_2e4);
      local_2e8 = *pvVar8;
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&local_c8,(long)local_2e8);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,1);
      local_2ec = *pvVar8;
      iVar3 = local_2e0;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)local_2ec);
      if (*pvVar8 <= iVar3) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)local_2ec);
        local_2e0 = *pvVar8;
      }
      local_2e4 = local_2e4 + 1;
    }
    iVar4 = local_2e0;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)local_2dc);
    iVar3 = local_2e0;
    if (*pvVar8 <= iVar4) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)local_2dc);
      iVar3 = *pvVar8;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)local_2dc);
    *pvVar8 = iVar3;
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(iVar3,in_stack_fffffffffffffaf0),
                        (size_type)in_stack_fffffffffffffae8);
    local_300 = rVar12;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_300);
    if (bVar1) {
      this_00 = (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)(in_RDI + 0x24);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)this_00,(long)local_2dc);
      *pvVar8 = *pvVar8 + -1;
      in_stack_fffffffffffffae0 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 0x16);
      vVar13 = local_2dc;
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)this_00,(long)local_2dc);
      in_stack_fffffffffffffae8 =
           std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::operator[](this_00,(key_type *)
                                CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      *in_stack_fffffffffffffae8 = vVar13;
    }
  }
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a366f);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffae0);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x2a3689)
  ;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffae0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffae0);
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a36b0);
  return;
}

Assistant:

void KosarajuSCC::_set_levels(int start, int sink) {
	const int start_scc = scc_of(start);
	std::stack<int> s;
	s.push(start);

	std::vector<std::vector<int> > scc_graph_out =
			std::vector<std::vector<int> >(nb_sccs(), std::vector<int>());
	std::vector<std::vector<int> > scc_graph_ends;
	is_mand = std::vector<bool>(nb_sccs(), false);
	std::vector<bool> seen = std::vector<bool>(nb_nodes, false);
	std::vector<std::vector<int> > matrix =
			std::vector<std::vector<int> >(nb_sccs(), std::vector<int>(nb_sccs(), 0));

	level2mandscc = std::unordered_map<int, int>();
	mandscc2somenode = std::unordered_map<int, int>();
	int edges = 0;
	int mand_sccs = 0;
	while (!s.empty()) {
		const int u = s.top();
		seen[u] = true;
		s.pop();
		if (mandatory_node(u) && !is_mand[scc_of(u)]) {
			is_mand[scc_of(u)] = true;
			mandscc2somenode[scc_of(u)] = u;
			mand_sccs++;
		}
		for (unsigned int i = 0; i < outgoing[u].size(); ++i) {
			const int e = outgoing[u][i];
			const int v = ends[e][1];
			if (ignore_edge(e) || ignore_node(v)) {
				continue;
			}
			if (scc_of(u) != scc_of(v) && matrix[scc_of(u)][scc_of(v)] == 0) {
				scc_graph_out[scc_of(u)].push_back(edges);
				scc_graph_ends.emplace_back();
				scc_graph_ends.back().push_back(scc_of(u));
				scc_graph_ends.back().push_back(scc_of(v));
				edges++;
				matrix[scc_of(u)][scc_of(v)] = 1;
			}
			if (!seen[v]) {
				s.push(v);
			}
		}
	}
	/*std::cout<<"\n";
		std::cout<<"SCC GRAPH"<<std::endl;
		for (int i = 0; i < scc_graph_out.size(); i++) {
		for (int j = 0; j < scc_graph_out[i].size(); j++) {
		std::cout<<scc_graph_out[i][j]<<"(to "
		<<scc_graph_ends[scc_graph_out[i][j]][1]<<") ";
		}
		std::cout<<std::endl;
		}
		std::cout<<std::endl;
		std::cout<<"MANDS ";
		for (int i = 0; i < nb_sccs(); i++) {
		std::cout<<is_mand[i]<<" ";
		}
		std::cout<<std::endl;
		//*/
	std::queue<int> topo;
	seen = std::vector<bool>(nb_sccs(), false);
	topological_sort(start_scc, scc_graph_out, scc_graph_ends, topo, seen);

	levels = std::vector<int>(nb_sccs(), nb_sccs() + 10);
	levels[scc_of(sink)] = mand_sccs;

	while (!topo.empty()) {
		const int u = topo.front();
		topo.pop();
		int min = nb_sccs() + 10;
		// std::cout<<"Looking at "<<u<<std::endl;
		for (unsigned int i = 0; i < scc_graph_out[u].size(); ++i) {
			const int e = scc_graph_out[u][i];
			const int v = scc_graph_ends[e][1];
			min = (min < levels[v]) ? min : levels[v];
		}
		levels[u] = (min < levels[u]) ? min : levels[u];
		if (is_mand[u]) {
			levels[u] -= 1;
			level2mandscc[levels[u]] = u;
		}
	}
	/*std::cout<<"LEVELS: "<<mand_sccs<<"     ";
		for (int i = 0; i < nb_sccs(); i++)
		std::cout<<levels[i]<<" ";
		std::cout<<std::endl;
	*/
}